

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O3

void VP8InitFilter(VP8EncIterator *it)

{
  if (it->lf_stats != (LFStats *)0x0) {
    memset(it->lf_stats,0,0x800);
    VP8SSIMDspInit();
    return;
  }
  return;
}

Assistant:

void VP8InitFilter(VP8EncIterator* const it) {
#if !defined(WEBP_REDUCE_SIZE)
  if (it->lf_stats != NULL) {
    int s, i;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      for (i = 0; i < MAX_LF_LEVELS; i++) {
        (*it->lf_stats)[s][i] = 0;
      }
    }
    VP8SSIMDspInit();
  }
#else
  (void)it;
#endif
}